

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O0

Individual *
Individual::makeRandom(Individual *__return_storage_ptr__,shared_ptr<Instance> *instance)

{
  int iVar1;
  element_type *peVar2;
  reference pvVar3;
  int local_48;
  int randomCore;
  int i;
  shared_ptr<Instance> local_38;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int numerOfCores;
  int numberOfTasks;
  shared_ptr<Instance> *instance_local;
  Individual *outcome;
  
  _numerOfCores = instance;
  instance_local = (shared_ptr<Instance> *)__return_storage_ptr__;
  peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      instance);
  local_1c = Instance::getNumTasks(peVar2);
  peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      instance);
  local_20 = Instance::getNumProcessors(peVar2);
  local_21 = 0;
  std::shared_ptr<Instance>::shared_ptr(&local_38,instance);
  Individual(__return_storage_ptr__,&local_38,(long)local_1c);
  std::shared_ptr<Instance>::~shared_ptr(&local_38);
  for (local_48 = 0; local_48 < local_1c; local_48 = local_48 + 1) {
    iVar1 = rand();
    iVar1 = iVar1 % local_20;
    pvVar3 = std::vector<int,_std::allocator<int>_>::at
                       (&__return_storage_ptr__->coresAsignedToTasks,(long)local_48);
    *pvVar3 = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Individual Individual::makeRandom(std::shared_ptr<Instance> instance){
	int numberOfTasks = instance->getNumTasks();
	int numerOfCores = instance->getNumProcessors();
	Individual outcome(instance, numberOfTasks);
	for(int i = 0; i < numberOfTasks; i++){
		int randomCore = rand() % numerOfCores;
		outcome.coresAsignedToTasks.at(i) = randomCore;
	}
	return outcome;
}